

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::AssertCheckHeapBlockNotInAnyList
          (HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock)

{
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar1;
  code *pcVar2;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock_1;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *pSVar3;
  undefined4 *puVar4;
  bool bVar5;
  
  pSVar3 = this->heapBlockList;
  bVar5 = pSVar3 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  if (pSVar3 != heapBlock && bVar5) {
    do {
      pSVar1 = (pSVar3->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
               super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
               super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
      if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) goto LAB_006d0d48;
      pSVar3 = HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                         (&pSVar1->super_HeapBlock);
      bVar5 = pSVar3 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)
                        0x0;
    } while ((pSVar3 != heapBlock) &&
            (pSVar3 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0
            ));
  }
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x19e,"(!HeapBlockList::Contains(heapBlock, heapBlockList))",
                       "The heap block already exists in the heapBlockList.");
    if (!bVar5) goto LAB_006d0e6e;
    *puVar4 = 0;
  }
LAB_006d0d48:
  pSVar3 = this->fullBlockList;
  bVar5 = pSVar3 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  if (pSVar3 != heapBlock && bVar5) {
    do {
      pSVar1 = (pSVar3->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
               super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
               super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
      if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) goto LAB_006d0dd8;
      pSVar3 = HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                         (&pSVar1->super_HeapBlock);
      bVar5 = pSVar3 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)
                        0x0;
    } while ((pSVar3 != heapBlock) &&
            (pSVar3 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0
            ));
  }
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x19f,"(!HeapBlockList::Contains(heapBlock, fullBlockList))",
                       "The heap block already exists in the fullBlockList.");
    if (!bVar5) goto LAB_006d0e6e;
    *puVar4 = 0;
  }
LAB_006d0dd8:
  pSVar3 = this->emptyBlockList;
  bVar5 = pSVar3 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  if (pSVar3 != heapBlock && bVar5) {
    do {
      pSVar1 = (pSVar3->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
               super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
               super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
      if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
        return;
      }
      pSVar3 = HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                         (&pSVar1->super_HeapBlock);
      bVar5 = pSVar3 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)
                        0x0;
    } while ((pSVar3 != heapBlock) &&
            (pSVar3 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0
            ));
  }
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x1a0,"(!HeapBlockList::Contains(heapBlock, emptyBlockList))",
                       "The heap block already exists in the emptyBlockList.");
    if (!bVar5) {
LAB_006d0e6e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::AssertCheckHeapBlockNotInAnyList(TBlockType * heapBlock)
{
#if DBG
    AssertMsg(!HeapBlockList::Contains(heapBlock, heapBlockList), "The heap block already exists in the heapBlockList.");
    AssertMsg(!HeapBlockList::Contains(heapBlock, fullBlockList), "The heap block already exists in the fullBlockList.");
    AssertMsg(!HeapBlockList::Contains(heapBlock, emptyBlockList), "The heap block already exists in the emptyBlockList.");
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    AssertMsg(!HeapBlockList::Contains(heapBlock, sweepableHeapBlockList), "The heap block already exists in the sweepableHeapBlockList.");
#endif
#endif
}